

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall
httplib::Client::process_request
          (Client *this,Stream *strm,Request *req,Response *res,bool last_connection,
          bool *connection_close)

{
  bool bVar1;
  int iVar2;
  const_iterator cVar3;
  char *__s;
  ContentReceiver out;
  int dummy_status;
  _Any_data local_b8;
  undefined1 local_a8 [24];
  anon_class_8_1_ba1d73fe local_90 [2];
  undefined1 local_80 [80];
  
  bVar1 = write_request(this,strm,req,last_connection);
  if (!bVar1) {
    return false;
  }
  bVar1 = read_response_line(this,strm,res);
  if (!bVar1) {
    return false;
  }
  bVar1 = detail::read_headers(strm,&res->headers);
  if (!bVar1) {
    return false;
  }
  local_b8._M_unused._M_object = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Connection","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(res->headers)._M_t,(key_type *)&local_b8);
  if ((Response *)local_b8._M_unused._0_8_ != (Response *)local_a8) {
    operator_delete(local_b8._M_unused._M_object,(ulong)(local_a8._0_8_ + 1));
  }
  if ((_Rb_tree_header *)cVar3._M_node == &(res->headers)._M_t._M_impl.super__Rb_tree_header) {
    __s = "";
  }
  else {
    __s = *(char **)(cVar3._M_node + 2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,__s,(allocator<char> *)local_b8._M_pod_data);
  iVar2 = std::__cxx11::string::compare((char *)local_90);
  if (iVar2 == 0) {
    if (local_90[0].req != (Request *)local_80) {
      operator_delete(local_90[0].req,(ulong)(local_80._0_8_ + 1));
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)res);
    if (local_90[0].req != (Request *)local_80) {
      operator_delete(local_90[0].req,(ulong)(local_80._0_8_ + 1));
    }
    if (iVar2 != 0) goto LAB_001624fc;
  }
  *connection_close = true;
LAB_001624fc:
  if (((req->response_handler).super__Function_base._M_manager != (_Manager_type)0x0) &&
     (bVar1 = (*(req->response_handler)._M_invoker)((_Any_data *)&req->response_handler,res), !bVar1
     )) {
    return false;
  }
  iVar2 = std::__cxx11::string::compare((char *)req);
  if ((iVar2 != 0) && (iVar2 = std::__cxx11::string::compare((char *)req), iVar2 != 0)) {
    local_b8._8_8_ = 0;
    local_a8._8_8_ =
         std::
         _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/httplib/httplib.h:3827:27)>
         ::_M_invoke;
    local_a8._0_8_ =
         std::
         _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/httplib/httplib.h:3827:27)>
         ::_M_manager;
    local_b8._M_unused._M_object = res;
    if ((req->content_receiver).super__Function_base._M_manager != (_Manager_type)0x0) {
      local_90[0].req = req;
      std::function<bool(char_const*,unsigned_long)>::operator=
                ((function<bool(char_const*,unsigned_long)> *)local_b8._M_pod_data,local_90);
    }
    std::function<bool_(unsigned_long,_unsigned_long)>::function
              ((function<bool_(unsigned_long,_unsigned_long)> *)(local_80 + 0x30),&req->progress);
    std::function<bool_(const_char_*,_unsigned_long)>::function
              ((function<bool_(const_char_*,_unsigned_long)> *)(local_80 + 0x10),
               (function<bool_(const_char_*,_unsigned_long)> *)&local_b8);
    bVar1 = detail::read_content<httplib::Response>
                      (strm,res,0xffffffffffffffff,(int *)local_90,(Progress *)(local_80 + 0x30),
                       (ContentReceiver *)(local_80 + 0x10));
    if ((_Base_ptr)local_80._32_8_ != (_Base_ptr)0x0) {
      (*(code *)local_80._32_8_)(local_80 + 0x10,local_80 + 0x10,3);
    }
    if ((code *)local_80._64_8_ != (code *)0x0) {
      (*(code *)local_80._64_8_)(local_80 + 0x30,local_80 + 0x30,3);
    }
    if ((code *)local_a8._0_8_ != (code *)0x0) {
      (*(code *)local_a8._0_8_)(&local_b8,&local_b8,3);
    }
    if (!bVar1) {
      return false;
    }
  }
  if ((this->logger_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->logger_)._M_invoker)((_Any_data *)&this->logger_,req,res);
    return true;
  }
  return true;
}

Assistant:

inline bool Client::process_request(Stream &strm, const Request &req,
                                    Response &res, bool last_connection,
                                    bool &connection_close) {
  // Send request
  if (!write_request(strm, req, last_connection)) { return false; }

  // Receive response and headers
  if (!read_response_line(strm, res) ||
      !detail::read_headers(strm, res.headers)) {
    return false;
  }

  if (res.get_header_value("Connection") == "close" ||
      res.version == "HTTP/1.0") {
    connection_close = true;
  }

  if (req.response_handler) {
    if (!req.response_handler(res)) { return false; }
  }

  // Body
  if (req.method != "HEAD" && req.method != "CONNECT") {
    ContentReceiver out = [&](const char *buf, size_t n) {
      if (res.body.size() + n > res.body.max_size()) { return false; }
      res.body.append(buf, n);
      return true;
    };

    if (req.content_receiver) {
      out = [&](const char *buf, size_t n) {
        return req.content_receiver(buf, n);
      };
    }

    int dummy_status;
    if (!detail::read_content(strm, res, std::numeric_limits<size_t>::max(),
                              dummy_status, req.progress, out)) {
      return false;
    }
  }

  // Log
  if (logger_) { logger_(req, res); }

  return true;
}